

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

sub_form __thiscall goodform::sub_form::at(sub_form *this,size_t index,any *default_variant)

{
  sub_form sVar1;
  vector<std::any,_std::allocator<std::any>_> local_58;
  array_validator local_40;
  any *local_30;
  any *default_variant_local;
  size_t index_local;
  sub_form *this_local;
  any *local_10;
  
  local_58.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_30 = default_variant;
  default_variant_local = (any *)index;
  index_local = (size_t)this;
  std::vector<std::any,_std::allocator<std::any>_>::vector(&local_58);
  local_40 = array(this,&local_58);
  sVar1 = array_validator::at(&local_40,(size_t)default_variant_local,local_30);
  local_10 = sVar1.variant_;
  this_local = (sub_form *)sVar1.error_;
  std::vector<std::any,_std::allocator<std::any>_>::~vector(&local_58);
  sVar1.variant_ = local_10;
  sVar1.error_ = (error_message *)this_local;
  return sVar1;
}

Assistant:

sub_form sub_form::at(size_t index, const any& default_variant)
  {
    return this->array(std::vector<any>()).at(index, default_variant);
  }